

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O2

int spotrs_(char *uplo,integer *n,integer *nrhs,real *a,integer *lda,real *b,integer *ldb,
           integer *info)

{
  int iVar1;
  logical lVar2;
  int iVar3;
  char *transa;
  char *uplo_00;
  integer i__1;
  
  *info = 0;
  spotrs_::upper = lsame_(uplo,"U");
  if ((spotrs_::upper == 0) && (lVar2 = lsame_(uplo,"L"), lVar2 == 0)) {
    iVar3 = -1;
  }
  else {
    iVar1 = *n;
    if (iVar1 < 0) {
      iVar3 = -2;
    }
    else if (*nrhs < 0) {
      iVar3 = -3;
    }
    else {
      iVar3 = iVar1 + (uint)(iVar1 == 0);
      if (*lda < iVar3) {
        iVar3 = -5;
      }
      else {
        if (iVar3 <= *ldb) {
          iVar3 = *info;
          if (iVar3 == 0) {
            if (*nrhs == 0 || iVar1 == 0) {
              return 0;
            }
            if (spotrs_::upper == 0) {
              strsm_("Left","Lower","No transpose","Non-unit",n,nrhs,&c_b164,a,lda,b,ldb);
              transa = "Transpose";
              uplo_00 = "Lower";
            }
            else {
              strsm_("Left","Upper","Transpose","Non-unit",n,nrhs,&c_b164,a,lda,b,ldb);
              transa = "No transpose";
              uplo_00 = "Upper";
            }
            strsm_("Left",uplo_00,transa,"Non-unit",n,nrhs,&c_b164,a,lda,b,ldb);
            return 0;
          }
          goto LAB_0011600e;
        }
        iVar3 = -7;
      }
    }
  }
  *info = iVar3;
LAB_0011600e:
  i__1 = -iVar3;
  xerbla_("SPOTRS",&i__1);
  return 0;
}

Assistant:

int spotrs_(char *uplo, integer *n, integer *nrhs, real *a,
	integer *lda, real *b, integer *ldb, integer *info)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, i__1;

    /* Local variables */
    extern logical lsame_(char *, char *);
    static logical upper;
    extern /* Subroutine */ int strsm_(char *, char *, char *, char *,
	    integer *, integer *, real *, real *, integer *, real *, integer *
	    ), xerbla_(char *, integer *);


/*
    -- LAPACK routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       March 31, 1993


    Purpose
    =======

    SPOTRS solves a system of linear equations A*X = B with a symmetric
    positive definite matrix A using the Cholesky factorization
    A = U**T*U or A = L*L**T computed by SPOTRF.

    Arguments
    =========

    UPLO    (input) CHARACTER*1
            = 'U':  Upper triangle of A is stored;
            = 'L':  Lower triangle of A is stored.

    N       (input) INTEGER
            The order of the matrix A.  N >= 0.

    NRHS    (input) INTEGER
            The number of right hand sides, i.e., the number of columns
            of the matrix B.  NRHS >= 0.

    A       (input) REAL array, dimension (LDA,N)
            The triangular factor U or L from the Cholesky factorization
            A = U**T*U or A = L*L**T, as computed by SPOTRF.

    LDA     (input) INTEGER
            The leading dimension of the array A.  LDA >= max(1,N).

    B       (input/output) REAL array, dimension (LDB,NRHS)
            On entry, the right hand side matrix B.
            On exit, the solution matrix X.

    LDB     (input) INTEGER
            The leading dimension of the array B.  LDB >= max(1,N).

    INFO    (output) INTEGER
            = 0:  successful exit
            < 0:  if INFO = -i, the i-th argument had an illegal value

    =====================================================================


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;

    /* Function Body */
    *info = 0;
    upper = lsame_(uplo, "U");
    if (! upper && ! lsame_(uplo, "L")) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*nrhs < 0) {
	*info = -3;
    } else if (*lda < max(1,*n)) {
	*info = -5;
    } else if (*ldb < max(1,*n)) {
	*info = -7;
    }
    if (*info != 0) {
	i__1 = -(*info);
	xerbla_("SPOTRS", &i__1);
	return 0;
    }

/*     Quick return if possible */

    if (*n == 0 || *nrhs == 0) {
	return 0;
    }

    if (upper) {

/*
          Solve A*X = B where A = U'*U.

          Solve U'*X = B, overwriting B with X.
*/

	strsm_("Left", "Upper", "Transpose", "Non-unit", n, nrhs, &c_b164, &a[
		a_offset], lda, &b[b_offset], ldb);

/*        Solve U*X = B, overwriting B with X. */

	strsm_("Left", "Upper", "No transpose", "Non-unit", n, nrhs, &c_b164,
		&a[a_offset], lda, &b[b_offset], ldb);
    } else {

/*
          Solve A*X = B where A = L*L'.

          Solve L*X = B, overwriting B with X.
*/

	strsm_("Left", "Lower", "No transpose", "Non-unit", n, nrhs, &c_b164,
		&a[a_offset], lda, &b[b_offset], ldb);

/*        Solve L'*X = B, overwriting B with X. */

	strsm_("Left", "Lower", "Transpose", "Non-unit", n, nrhs, &c_b164, &a[
		a_offset], lda, &b[b_offset], ldb);
    }

    return 0;

/*     End of SPOTRS */

}